

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printImmScale(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  cs_ac_type cVar3;
  cs_struct *h;
  MCOperand *op;
  int64_t iVar4;
  long lVar5;
  int in_ECX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  int64_t val;
  int64_t in_stack_ffffffffffffffb8;
  SStream *in_stack_ffffffffffffffc0;
  cs_struct *pcVar6;
  
  h = (cs_struct *)(long)in_ECX;
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  lVar5 = (long)h * iVar4;
  printInt64Bang(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    if ((in_RDI->csh->doing_mem & 1U) == 0) {
      pcVar6 = in_RDI->csh;
      MCInst_getOpcode(in_RDI);
      cVar3 = get_op_access(h,(uint)((ulong)pcVar6 >> 0x20),(uint)pcVar6);
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar3;
      in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(long *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = lVar5;
      pcVar2 = in_RDI->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
    else {
      *(int *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x3d) = (int)lVar5;
    }
  }
  return;
}

Assistant:

static void printImmScale(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	int64_t val = Scale * MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	printInt64Bang(O, val);

	if (MI->csh->detail) {
		if (MI->csh->doing_mem) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.disp = (int32_t)val;
		} else {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}